

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerialArena::AllocateNewBlock(SerialArena *this,size_t n)

{
  ArenaBlock *this_00;
  __pointer_type pcVar1;
  char *pcVar2;
  ArenaBlock *this_01;
  char *pcVar3;
  size_t last_size;
  SizedPtr SVar4;
  
  this_00 = (this->head_)._M_b._M_p;
  if (this_00->size == 0) {
    last_size = 0;
  }
  else {
    pcVar1 = (this->ptr_)._M_b._M_p;
    pcVar2 = ArenaBlock::Pointer(this_00,0x10);
    (this->space_used_).super___atomic_base<unsigned_long>._M_i =
         (__int_type_conflict3)
         (pcVar1 + ((this->space_used_).super___atomic_base<unsigned_long>._M_i - (long)pcVar2));
    last_size = this_00->size;
  }
  SVar4 = anon_unknown_12::AllocateBlock
                    ((AllocationPolicy *)
                     ((this->parent_->alloc_policy_).policy_ & 0xfffffffffffffff8),last_size,n);
  this_01 = (ArenaBlock *)SVar4.p;
  (this->space_allocated_).super___atomic_base<unsigned_long>._M_i =
       (this->space_allocated_).super___atomic_base<unsigned_long>._M_i + SVar4.n;
  ArenaBlock::ArenaBlock(this_01,this_00,SVar4.n);
  pcVar2 = ArenaBlock::Pointer(this_01,0x10);
  pcVar3 = ArenaBlock::Limit(this_01);
  (this->ptr_)._M_b._M_p = pcVar2;
  this->prefetch_ptr_ = pcVar2;
  this->limit_ = pcVar3;
  (this->head_)._M_b._M_p = this_01;
  return;
}

Assistant:

void SerialArena::AllocateNewBlock(size_t n) {
  size_t used = 0;
  size_t wasted = 0;
  ArenaBlock* old_head = head();
  if (!old_head->IsSentry()) {
    // Record how much used in this block.
    used = static_cast<size_t>(ptr() - old_head->Pointer(kBlockHeaderSize));
    wasted = old_head->size - used - kBlockHeaderSize;
    AddSpaceUsed(used);
  }

  // TODO: Evaluate if pushing unused space into the cached blocks is a
  // win. In preliminary testing showed increased memory savings as expected,
  // but with a CPU regression. The regression might have been an artifact of
  // the microbenchmark.

  auto mem = AllocateBlock(parent_.AllocPolicy(), old_head->size, n);
  AddSpaceAllocated(mem.n);
  ThreadSafeArenaStats::RecordAllocateStats(parent_.arena_stats_.MutableStats(),
                                            /*used=*/used,
                                            /*allocated=*/mem.n, wasted);
  auto* new_head = new (mem.p) ArenaBlock{old_head, mem.n};
  set_range(new_head->Pointer(kBlockHeaderSize), new_head->Limit());
  // Previous writes must take effect before writing new head.
  head_.store(new_head, std::memory_order_release);

  internal::PoisonMemoryRegion(ptr(), limit_ - ptr());
}